

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

shared_ptr<std::vector<int,_std::allocator<int>_>_> __thiscall
RandomForest::Node<float>::GetSampleIndexList(Node<float> *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<std::vector<int,_std::allocator<int>_>_> sVar1;
  Node<float> *this_local;
  
  std::shared_ptr<std::vector<int,_std::allocator<int>_>_>::shared_ptr
            ((shared_ptr<std::vector<int,_std::allocator<int>_>_> *)this,
             (shared_ptr<std::vector<int,_std::allocator<int>_>_> *)(in_RSI + 0x40));
  sVar1.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<std::vector<int,_std::allocator<int>_>_>)
         sVar1.
         super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::vector<int> > RandomForest::Node<T>::GetSampleIndexList() const
{
    return sampleIndexList;
}